

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O1

void __thiscall FParser::EvaluateFunction(FParser *this,svalue_t *result,int start,int stop)

{
  int iVar1;
  DFsVariable *pDVar2;
  code *pcVar3;
  long lVar4;
  int start_00;
  svalue_t *result_00;
  int iVar5;
  svalue_t argv [128];
  DFsVariable *local_c48;
  svalue_t *local_c40;
  svalue_t local_c38 [128];
  
  lVar4 = 0x10;
  do {
    *(undefined8 *)((long)local_c38 + lVar4 + -8) = 0x87e02c;
    *(undefined4 *)((long)&local_c48 + lVar4) = 1;
    *(undefined4 *)((long)&local_c38[0].type + lVar4) = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xc10);
  FString::NullString.RefCount = FString::NullString.RefCount + 0x80;
  if (((this->TokenType[start] == function) && (this->TokenType[stop] == operator_)) &&
     (*this->Tokens[stop] == ')')) {
    pDVar2 = DFsScript::VariableForName(global_script,this->Tokens[start]);
    if (pDVar2 == (DFsVariable *)0x0) {
      pDVar2 = (DFsVariable *)0x0;
      script_error("no such function: \'%s\'\n",this->Tokens[start]);
    }
    else if ((pDVar2->type != 3) && (pDVar2->type != 9)) {
      script_error("\'%s\' not a function\n",this->Tokens[start]);
    }
  }
  else {
    pDVar2 = (DFsVariable *)0x0;
    script_error("misplaced closing paren\n");
  }
  start_00 = start + 2;
  iVar5 = 0;
  result_00 = local_c38;
  if (start_00 < stop) {
    iVar5 = 0;
    local_c48 = pDVar2;
    local_c40 = result;
    do {
      iVar1 = FindOperator(this,start_00,stop + -1,",");
      if (iVar1 == -1) {
        iVar1 = stop;
      }
      result = local_c40;
      pDVar2 = local_c48;
      if (iVar1 <= start_00) break;
      EvaluateExpression(this,result_00,start_00,iVar1 + -1);
      start_00 = iVar1 + 1;
      iVar5 = iVar5 + 1;
      result_00 = result_00 + 1;
      result = local_c40;
      pDVar2 = local_c48;
    } while (start_00 < stop);
  }
  this->t_argc = iVar5;
  this->t_argv = local_c38;
  (this->t_return).type = 1;
  (this->t_return).value.i = 0;
  if (pDVar2->type == 3) {
    pcVar3 = (code *)(pDVar2->value).handler;
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *(long *)((long)this->Tokens +
                                            *(long *)((long)&pDVar2->value + 8) + -0x10) + -1);
    }
    (*pcVar3)();
  }
  else {
    RunLineSpecial(this,(pDVar2->value).ls);
  }
  result->type = (this->t_return).type;
  FString::operator=(&result->string,&(this->t_return).string);
  result->value = (this->t_return).value;
  lVar4 = 0xbf0;
  do {
    FString::~FString((FString *)((long)&local_c38[0].type + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x10);
  return;
}

Assistant:

void FParser::EvaluateFunction(svalue_t &result, int start, int stop)
{
	DFsVariable *func = NULL;
	int startpoint, endpoint;
	
	// the arguments need to be built locally in case of
	// function returns as function arguments eg
	// print("here is a random number: ", rnd() );
	
	int argc;
	svalue_t argv[MAXARGS];
	
	if(TokenType[start] != function || TokenType[stop] != operator_
		|| Tokens[stop][0] != ')' )
	{
		script_error("misplaced closing paren\n");
	}
	
	// all the functions are stored in the global script
	else if( !(func = global_script->VariableForName (Tokens[start]))  )
	{
		script_error("no such function: '%s'\n",Tokens[start]);
	}
	
	else if(func->type != svt_function && func->type != svt_linespec)
	{
		script_error("'%s' not a function\n", Tokens[start]);
	}
	
	// build the argument list
	// use a C command-line style system rather than
	// a system using a fixed length list
	
	argc = 0;
	endpoint = start + 2;   // ignore the function name and first bracket
	
	while(endpoint < stop)
    {
		startpoint = endpoint;
		endpoint = FindOperator(startpoint, stop-1, ",");
		
		// check for -1: no more ','s 
		if(endpoint == -1)
		{               // evaluate the last expression
			endpoint = stop;
		}
		if(endpoint-1 < startpoint)
			break;
		
		EvaluateExpression(argv[argc], startpoint, endpoint-1);
		endpoint++;    // skip the ','
		argc++;
    }
	
	// store the arguments in the global arglist
	t_argc = argc;
	t_argv = argv;
	
	// haleyjd: return values can propagate to void functions, so
	// t_return needs to be cleared now
	
	t_return.type = svt_int;
	t_return.value.i = 0;
	
	// now run the function
	if (func->type == svt_function)
	{
		(this->*func->value.handler)();
	}
	else
	{
		RunLineSpecial(func->value.ls);
	}
	
	// return the returned value
	result = t_return;
}